

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O2

timestamp_t duckdb::Timestamp::FromEpochSecondsPossiblyInfinite(int64_t sec)

{
  bool bVar1;
  ConversionException *this;
  allocator local_41;
  int64_t result;
  string local_38;
  
  bVar1 = TryMultiplyOperator::Operation<long,long,long>(sec,1000000,&result);
  if (bVar1) {
    return (timestamp_t)result;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Could not convert Timestamp(S) to Timestamp(US)",&local_41);
  ConversionException::ConversionException(this,&local_38);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

timestamp_t Timestamp::FromEpochSecondsPossiblyInfinite(int64_t sec) {
	int64_t result;
	if (!TryMultiplyOperator::Operation(sec, Interval::MICROS_PER_SEC, result)) {
		throw ConversionException("Could not convert Timestamp(S) to Timestamp(US)");
	}
	return timestamp_t(result);
}